

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper::
acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper
          (acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper *this,TestDetails *details)

{
  acceptorT11Fixture::acceptorT11Fixture(&this->super_acceptorT11Fixture);
  (this->super_acceptorT11Fixture).super_sessionT11Fixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionT11Fixture_00325a00;
  (this->super_acceptorT11Fixture).super_sessionT11Fixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)&PTR__acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper_00325a58;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(acceptorT11Fixture, nextResendRequestT1150RepeatingGroup)
{
  object->next( createT11Logon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  FIX::Message message = createT1150ExecutionReport( "ISLD", "TW", 2 );
  CHECK( object->send( message ) );
  object->next( createT11ResendRequest( "ISLD", "TW", 3, 2, 2 ), UtcTimeStamp() );

  PossDupFlag possDupFlag;
  OrigSendingTime origSendingTime;
  SendingTime sendingTime;
  lastResent.getHeader().getField( possDupFlag );
  lastResent.getHeader().getField( origSendingTime );
  lastResent.getHeader().getField( sendingTime );
  message.getHeader().setField( possDupFlag );
  message.getHeader().setField( origSendingTime );
  message.getHeader().setField( sendingTime );
  CHECK_EQUAL( message.toString(), lastResent.toString() );
}